

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::PushColumnsBackground(void)

{
  int iVar1;
  ImGuiColumns *pIVar2;
  ImGuiWindow *pIVar3;
  int cmd_size;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  
  pIVar3 = GetCurrentWindowRead();
  pIVar2 = (pIVar3->DC).CurrentColumns;
  if (pIVar2->Count != 1) {
    ImDrawList::ChannelsSetCurrent(pIVar3->DrawList,0);
    iVar1 = (pIVar3->DrawList->CmdBuffer).Size;
    PushClipRect(&(pIVar2->HostClipRect).Min,&(pIVar2->HostClipRect).Max,false);
    if (iVar1 != (pIVar3->DrawList->CmdBuffer).Size) {
      __assert_fail("cmd_size == window->DrawList->CmdBuffer.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui_widgets.cpp"
                    ,0x1c7d,"void ImGui::PushColumnsBackground()");
    }
  }
  return;
}

Assistant:

void ImGui::PushColumnsBackground()
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (columns->Count == 1)
        return;
    window->DrawList->ChannelsSetCurrent(0);
    int cmd_size = window->DrawList->CmdBuffer.Size;
    PushClipRect(columns->HostClipRect.Min, columns->HostClipRect.Max, false); 
    IM_UNUSED(cmd_size);
    IM_ASSERT(cmd_size == window->DrawList->CmdBuffer.Size); // Being in channel 0 this should not have created an ImDrawCmd
}